

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ArgSortLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argsort(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ArgSortLayerParams *pAVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_argsort(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_argsort(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ArgSortLayerParams>(arena);
    (this->layer_).argsort_ = pAVar2;
  }
  return (ArgSortLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgSortLayerParams* NeuralNetworkLayer::_internal_mutable_argsort() {
  if (!_internal_has_argsort()) {
    clear_layer();
    set_has_argsort();
    layer_.argsort_ = CreateMaybeMessage< ::CoreML::Specification::ArgSortLayerParams >(GetArenaForAllocation());
  }
  return layer_.argsort_;
}